

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_requirement.cpp
# Opt level: O3

void __thiscall
ImportRequirement_requirementsFixCircularRef_Test::
~ImportRequirement_requirementsFixCircularRef_Test
          (ImportRequirement_requirementsFixCircularRef_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ImportRequirement, requirementsFixCircularRef)
{
    const std::vector<std::string> e = {
        "importExample2components.cellml",
        "circularImport1.cellml",
        "importExample2units.cellml",
    };

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("import-requirements/importExample1.cellml"));

    auto requirements = model->importRequirements();
    EXPECT_EQ(e, requirements);
}